

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O2

void deqp::egl::logSurfaceAttribute(TestLog *log,EGLint attribute,EGLint value)

{
  ostringstream *this;
  char *pcVar1;
  SurfaceAttribValueFmt valueFmt;
  SurfaceAttribValueFmt local_1a8;
  MessageBuilder local_1a0;
  
  pcVar1 = eglu::getSurfaceAttribName(attribute);
  this = &local_1a0.m_str;
  local_1a8.attribute = attribute;
  local_1a8.value = value;
  local_1a0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::operator<<((ostream *)this,"  ");
  std::operator<<((ostream *)this,pcVar1);
  std::operator<<((ostream *)this,": ");
  eglu::operator<<((ostream *)this,&local_1a8);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

static void logSurfaceAttribute (tcu::TestLog& log, EGLint attribute, EGLint value)
{
	const char*								name		= eglu::getSurfaceAttribName(attribute);
	const eglu::SurfaceAttribValueFmt		valueFmt	(attribute, value);

	log << TestLog::Message << "  " << name << ": " << valueFmt << TestLog::EndMessage;
}